

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

int space_mixer_start(mixed_segment *segment)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = (ulong)*(byte *)((long)segment->data + 0x542c);
  uVar5 = 1;
  if (uVar4 != 0) {
    plVar2 = *(long **)((long)segment->data + 0x10);
    if (*plVar2 == 0) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar4 - 1 == uVar6) {
          return 1;
        }
        uVar1 = uVar6 + 1;
        lVar3 = uVar6 + 1;
        uVar6 = uVar1;
      } while (plVar2[lVar3] != 0);
      uVar5 = (uint)(uVar4 <= uVar1);
    }
    mixed_err(0x16);
  }
  return uVar5;
}

Assistant:

int space_mixer_start(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  for(int i=0; i<data->channels.count; ++i){
    if(!data->out[i]){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}